

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lu_byte luaH_getshortstr(Table *t,TString *key,TValue *res)

{
  int *piVar1;
  byte bVar2;
  TValue *io2;
  TValue *pTVar3;
  
  pTVar3 = (TValue *)(t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash));
  do {
    if ((((NodeKey *)pTVar3)->key_tt == 'D') &&
       ((TString *)(((NodeKey *)pTVar3)->key_val).gc == key)) goto LAB_0011c317;
    piVar1 = &((NodeKey *)pTVar3)->next;
    pTVar3 = (TValue *)((long)pTVar3 + (long)*piVar1 * 0x18);
  } while ((long)*piVar1 != 0);
  pTVar3 = &absentkey;
LAB_0011c317:
  bVar2 = ((NodeKey *)pTVar3)->tt_;
  if ((bVar2 & 0xf) != 0) {
    res->value_ = ((NodeKey *)pTVar3)->value_;
    bVar2 = ((NodeKey *)pTVar3)->tt_;
    res->tt_ = bVar2;
  }
  return bVar2 & 0x3f;
}

Assistant:

const TValue *luaH_Hgetshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(strisshr(key));
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (keyisshrstr(n) && eqshrstr(keystrval(n), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}